

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O2

void __thiscall OpenMPCriticalDirective::OpenMPCriticalDirective(OpenMPCriticalDirective *this)

{
  OpenMPDirective::OpenMPDirective(&this->super_OpenMPDirective,OMPD_critical,Lang_unknown,0,0);
  (this->critical_name)._M_dataplus._M_p = (pointer)&(this->critical_name).field_2;
  (this->critical_name)._M_string_length = 0;
  (this->critical_name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

OpenMPCriticalDirective( ) : OpenMPDirective(OMPD_critical) { }